

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_lvalue.cpp
# Opt level: O3

void __thiscall
iu_StringSplitLvalue_x_iutest_x_ExtractByStlStr_Test<char>::Body
          (iu_StringSplitLvalue_x_iutest_x_ExtractByStlStr_Test<char> *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R9;
  bool bVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> delim;
  AssertionResult iutest_ar;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> s;
  AssertionHelper local_3d8;
  split_helper<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false,_true>
  local_3a8;
  long *local_388;
  long local_380;
  long local_378 [2];
  AssertionResult local_368;
  char *local_340;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_338;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_318;
  size_type local_310;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_308;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_2f8;
  size_type local_2f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_2d8;
  size_type local_2d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_2b8;
  size_type local_2b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_298;
  size_type local_290;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_288;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_278;
  size_type local_270;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_268;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_258;
  size_type local_250;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_248;
  undefined1 local_238 [128];
  ios_base local_1b8 [264];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_338._M_dataplus._M_p = (pointer)&local_338.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_338,"arikitari na_world!","");
  local_388 = local_378;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_388,"_ ","");
  local_340 = "arikitari";
  local_258 = &local_248;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_258,local_388,local_380 + (long)local_388);
  paVar1 = &local_3a8.delim.field_2;
  if (local_258 == &local_248) {
    local_3a8.delim.field_2._8_8_ = local_248._8_8_;
    local_3a8.delim._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_3a8.delim._M_dataplus._M_p = (pointer)local_258;
  }
  local_3a8.delim.field_2._M_allocated_capacity._1_7_ = local_248._M_allocated_capacity._1_7_;
  local_3a8.delim.field_2._M_local_buf[0] = local_248._M_local_buf[0];
  local_3a8.delim._M_string_length = local_250;
  local_250 = 0;
  local_248._M_local_buf[0] = '\0';
  local_258 = &local_248;
  detail::
  split_helper<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false,_true>
  ::operator[]((split_helper_index<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false,_true>
                *)local_238,&local_3a8,0);
  detail::
  operator|<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_true,_nullptr>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_3d8,
             &local_338,
             (split_helper_index<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false,_true>
              *)local_238);
  iutest::internal::CmpHelperEQ<char_const*,std::__cxx11::string>
            (&local_368,(internal *)"constant::arikitari<char_type>()","s | split(delim)[0]",
             (char *)&local_340,(char **)&local_3d8,in_R9);
  paVar2 = &local_3d8.m_part_result.super_iuCodeMessage.m_message.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3d8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p != paVar2) {
    operator_delete(local_3d8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                    local_3d8.m_part_result.super_iuCodeMessage.m_message.field_2.
                    _M_allocated_capacity + 1);
  }
  pcVar3 = local_238 + 0x10;
  if ((pointer)local_238._0_8_ != pcVar3) {
    operator_delete((void *)local_238._0_8_,local_238._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3a8.delim._M_dataplus._M_p != paVar1) {
    operator_delete(local_3a8.delim._M_dataplus._M_p,
                    local_3a8.delim.field_2._M_allocated_capacity + 1);
  }
  if (local_258 != &local_248) {
    operator_delete(local_258,
                    CONCAT71(local_248._M_allocated_capacity._1_7_,local_248._M_local_buf[0]) + 1);
  }
  if (local_368.m_result == false) {
    memset((iu_global_format_stringstream *)local_238,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_238);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_3d8,local_368.m_message._M_dataplus._M_p,
               (allocator<char> *)&local_3a8);
    local_3d8.m_part_result.super_iuCodeMessage.m_file =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/yumetodo[P]string_split/test/test_lvalue.cpp"
    ;
    local_3d8.m_part_result.super_iuCodeMessage.m_line = 0x101;
    local_3d8.m_part_result.super_iuCodeMessage._44_4_ = 2;
    iutest::AssertionHelper::OnFixed(&local_3d8,(Fixed *)local_238);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3d8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p != paVar2) {
      operator_delete(local_3d8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                      local_3d8.m_part_result.super_iuCodeMessage.m_message.field_2.
                      _M_allocated_capacity + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_238);
    std::ios_base::~ios_base(local_1b8);
    bVar5 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_368.m_message._M_dataplus._M_p == &local_368.m_message.field_2;
  }
  else {
    paVar4 = &local_368.m_message.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_368.m_message._M_dataplus._M_p != paVar4) {
      operator_delete(local_368.m_message._M_dataplus._M_p,
                      local_368.m_message.field_2._M_allocated_capacity + 1);
    }
    local_340 = "na";
    local_278 = &local_268;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_278,local_388,local_380 + (long)local_388);
    if (local_278 == &local_268) {
      local_3a8.delim.field_2._8_8_ = local_268._8_8_;
      local_3a8.delim._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_3a8.delim._M_dataplus._M_p = (pointer)local_278;
    }
    local_3a8.delim.field_2._M_allocated_capacity._1_7_ = local_268._M_allocated_capacity._1_7_;
    local_3a8.delim.field_2._M_local_buf[0] = local_268._M_local_buf[0];
    local_3a8.delim._M_string_length = local_270;
    local_270 = 0;
    local_268._M_local_buf[0] = '\0';
    local_278 = &local_268;
    detail::
    split_helper<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false,_true>
    ::operator[]((split_helper_index<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false,_true>
                  *)local_238,&local_3a8,1);
    detail::
    operator|<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_true,_nullptr>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_3d8,
               &local_338,
               (split_helper_index<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false,_true>
                *)local_238);
    iutest::internal::CmpHelperEQ<char_const*,std::__cxx11::string>
              (&local_368,(internal *)"constant::na<char_type>()","s | split(delim)[1]",
               (char *)&local_340,(char **)&local_3d8,in_R9);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3d8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p != paVar2) {
      operator_delete(local_3d8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                      local_3d8.m_part_result.super_iuCodeMessage.m_message.field_2.
                      _M_allocated_capacity + 1);
    }
    if ((pointer)local_238._0_8_ != pcVar3) {
      operator_delete((void *)local_238._0_8_,local_238._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3a8.delim._M_dataplus._M_p != paVar1) {
      operator_delete(local_3a8.delim._M_dataplus._M_p,
                      local_3a8.delim.field_2._M_allocated_capacity + 1);
    }
    if (local_278 != &local_268) {
      operator_delete(local_278,
                      CONCAT71(local_268._M_allocated_capacity._1_7_,local_268._M_local_buf[0]) + 1)
      ;
    }
    if (local_368.m_result == false) {
      memset((iu_global_format_stringstream *)local_238,0,0x188);
      iutest::iu_global_format_stringstream::iu_global_format_stringstream
                ((iu_global_format_stringstream *)local_238);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_3d8,local_368.m_message._M_dataplus._M_p,
                 (allocator<char> *)&local_3a8);
      local_3d8.m_part_result.super_iuCodeMessage.m_file =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/yumetodo[P]string_split/test/test_lvalue.cpp"
      ;
      local_3d8.m_part_result.super_iuCodeMessage.m_line = 0x102;
      local_3d8.m_part_result.super_iuCodeMessage._44_4_ = 2;
      iutest::AssertionHelper::OnFixed(&local_3d8,(Fixed *)local_238);
    }
    else {
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_368.m_message._M_dataplus._M_p != paVar4) {
        operator_delete(local_368.m_message._M_dataplus._M_p,
                        local_368.m_message.field_2._M_allocated_capacity + 1);
      }
      local_340 = "world!";
      local_298 = &local_288;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_298,local_388,local_380 + (long)local_388);
      if (local_298 == &local_288) {
        local_3a8.delim.field_2._8_8_ = local_288._8_8_;
        local_3a8.delim._M_dataplus._M_p = (pointer)paVar1;
      }
      else {
        local_3a8.delim._M_dataplus._M_p = (pointer)local_298;
      }
      local_3a8.delim.field_2._M_allocated_capacity._1_7_ = local_288._M_allocated_capacity._1_7_;
      local_3a8.delim.field_2._M_local_buf[0] = local_288._M_local_buf[0];
      local_3a8.delim._M_string_length = local_290;
      local_290 = 0;
      local_288._M_local_buf[0] = '\0';
      local_298 = &local_288;
      detail::
      split_helper<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false,_true>
      ::operator[]((split_helper_index<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false,_true>
                    *)local_238,&local_3a8,2);
      detail::
      operator|<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_true,_nullptr>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_3d8,
                 &local_338,
                 (split_helper_index<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false,_true>
                  *)local_238);
      iutest::internal::CmpHelperEQ<char_const*,std::__cxx11::string>
                (&local_368,(internal *)"constant::world<char_type>()","s | split(delim)[2]",
                 (char *)&local_340,(char **)&local_3d8,in_R9);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3d8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p != paVar2) {
        operator_delete(local_3d8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                        local_3d8.m_part_result.super_iuCodeMessage.m_message.field_2.
                        _M_allocated_capacity + 1);
      }
      if ((pointer)local_238._0_8_ != pcVar3) {
        operator_delete((void *)local_238._0_8_,local_238._16_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3a8.delim._M_dataplus._M_p != paVar1) {
        operator_delete(local_3a8.delim._M_dataplus._M_p,
                        local_3a8.delim.field_2._M_allocated_capacity + 1);
      }
      if (local_298 != &local_288) {
        operator_delete(local_298,
                        CONCAT71(local_288._M_allocated_capacity._1_7_,local_288._M_local_buf[0]) +
                        1);
      }
      if (local_368.m_result != false) {
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_368.m_message._M_dataplus._M_p != paVar4) {
          operator_delete(local_368.m_message._M_dataplus._M_p,
                          local_368.m_message.field_2._M_allocated_capacity + 1);
        }
        local_2b8 = &local_2a8;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_2b8,local_388,local_380 + (long)local_388);
        if (local_2b8 == &local_2a8) {
          local_3d8.m_part_result.super_iuCodeMessage.m_message.field_2._8_8_ = local_2a8._8_8_;
          local_3d8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p = (pointer)paVar2;
        }
        else {
          local_3d8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p =
               (pointer)local_2b8;
        }
        local_3d8.m_part_result.super_iuCodeMessage.m_message.field_2._M_allocated_capacity._1_7_ =
             local_2a8._M_allocated_capacity._1_7_;
        local_3d8.m_part_result.super_iuCodeMessage.m_message.field_2._M_local_buf[0] =
             local_2a8._M_local_buf[0];
        local_3d8.m_part_result.super_iuCodeMessage.m_message._M_string_length = local_2b0;
        local_2b0 = 0;
        local_2a8._M_local_buf[0] = '\0';
        local_2b8 = &local_2a8;
        detail::
        split_helper<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false,_true>
        ::operator[]((split_helper_index<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false,_true>
                      *)local_238,
                     (split_helper<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false,_true>
                      *)&local_3d8,3);
        detail::
        operator|<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_true,_nullptr>
                  (&local_50,&local_338,
                   (split_helper_index<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false,_true>
                    *)local_238);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
        if ((pointer)local_238._0_8_ != pcVar3) {
          operator_delete((void *)local_238._0_8_,local_238._16_8_ + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3d8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p != paVar2) {
          operator_delete(local_3d8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                          local_3d8.m_part_result.super_iuCodeMessage.m_message.field_2.
                          _M_allocated_capacity + 1);
        }
        if (local_2b8 != &local_2a8) {
          operator_delete(local_2b8,
                          CONCAT71(local_2a8._M_allocated_capacity._1_7_,local_2a8._M_local_buf[0])
                          + 1);
        }
        memset((iu_global_format_stringstream *)local_238,0,0x188);
        iutest::iu_global_format_stringstream::iu_global_format_stringstream
                  ((iu_global_format_stringstream *)local_238);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_3d8,
                   "\nExpected: s | split(delim)[3] throws an exception of type std::out_of_range.\n  Actual: it throws nothing."
                   ,(allocator<char> *)&local_368);
        local_3d8.m_part_result.super_iuCodeMessage.m_file =
             "/workspace/llm4binary/github/license_all_cmakelists_1510/yumetodo[P]string_split/test/test_lvalue.cpp"
        ;
        local_3d8.m_part_result.super_iuCodeMessage.m_line = 0x104;
        local_3d8.m_part_result.super_iuCodeMessage._44_4_ = 1;
        iutest::AssertionHelper::OnFixed(&local_3d8,(Fixed *)local_238);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3d8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p != paVar2) {
          operator_delete(local_3d8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                          local_3d8.m_part_result.super_iuCodeMessage.m_message.field_2.
                          _M_allocated_capacity + 1);
        }
        std::__cxx11::stringstream::~stringstream((stringstream *)local_238);
        std::ios_base::~ios_base(local_1b8);
        local_2d8 = &local_2c8;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_2d8,local_388,local_380 + (long)local_388);
        if (local_2d8 == &local_2c8) {
          local_3d8.m_part_result.super_iuCodeMessage.m_message.field_2._8_8_ = local_2c8._8_8_;
          local_3d8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p = (pointer)paVar2;
        }
        else {
          local_3d8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p =
               (pointer)local_2d8;
        }
        local_3d8.m_part_result.super_iuCodeMessage.m_message.field_2._M_allocated_capacity._1_7_ =
             local_2c8._M_allocated_capacity._1_7_;
        local_3d8.m_part_result.super_iuCodeMessage.m_message.field_2._M_local_buf[0] =
             local_2c8._M_local_buf[0];
        local_3d8.m_part_result.super_iuCodeMessage.m_message._M_string_length = local_2d0;
        local_2d0 = 0;
        local_2c8._M_local_buf[0] = '\0';
        local_2d8 = &local_2c8;
        detail::
        split_helper<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false,_true>
        ::operator[]((split_helper_index<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false,_true>
                      *)local_238,
                     (split_helper<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false,_true>
                      *)&local_3d8,5);
        detail::
        operator|<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_true,_nullptr>
                  (&local_70,&local_338,
                   (split_helper_index<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false,_true>
                    *)local_238);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != &local_70.field_2) {
          operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
        }
        if ((pointer)local_238._0_8_ != pcVar3) {
          operator_delete((void *)local_238._0_8_,local_238._16_8_ + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3d8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p != paVar2) {
          operator_delete(local_3d8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                          local_3d8.m_part_result.super_iuCodeMessage.m_message.field_2.
                          _M_allocated_capacity + 1);
        }
        if (local_2d8 != &local_2c8) {
          operator_delete(local_2d8,
                          CONCAT71(local_2c8._M_allocated_capacity._1_7_,local_2c8._M_local_buf[0])
                          + 1);
        }
        memset((iu_global_format_stringstream *)local_238,0,0x188);
        iutest::iu_global_format_stringstream::iu_global_format_stringstream
                  ((iu_global_format_stringstream *)local_238);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_3d8,
                   "\nExpected: s | split(delim)[5] throws an exception of type std::out_of_range.\n  Actual: it throws nothing."
                   ,(allocator<char> *)&local_368);
        local_3d8.m_part_result.super_iuCodeMessage.m_file =
             "/workspace/llm4binary/github/license_all_cmakelists_1510/yumetodo[P]string_split/test/test_lvalue.cpp"
        ;
        local_3d8.m_part_result.super_iuCodeMessage.m_line = 0x105;
        local_3d8.m_part_result.super_iuCodeMessage._44_4_ = 1;
        iutest::AssertionHelper::OnFixed(&local_3d8,(Fixed *)local_238);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3d8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p != paVar2) {
          operator_delete(local_3d8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                          local_3d8.m_part_result.super_iuCodeMessage.m_message.field_2.
                          _M_allocated_capacity + 1);
        }
        std::__cxx11::stringstream::~stringstream((stringstream *)local_238);
        std::ios_base::~ios_base(local_1b8);
        local_2f8 = &local_2e8;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_2f8,local_388,local_380 + (long)local_388);
        if (local_2f8 == &local_2e8) {
          local_3d8.m_part_result.super_iuCodeMessage.m_message.field_2._8_8_ = local_2e8._8_8_;
          local_3d8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p = (pointer)paVar2;
        }
        else {
          local_3d8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p =
               (pointer)local_2f8;
        }
        local_3d8.m_part_result.super_iuCodeMessage.m_message.field_2._M_allocated_capacity._1_7_ =
             local_2e8._M_allocated_capacity._1_7_;
        local_3d8.m_part_result.super_iuCodeMessage.m_message.field_2._M_local_buf[0] =
             local_2e8._M_local_buf[0];
        local_3d8.m_part_result.super_iuCodeMessage.m_message._M_string_length = local_2f0;
        local_2f0 = 0;
        local_2e8._M_local_buf[0] = '\0';
        local_2f8 = &local_2e8;
        detail::
        split_helper<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false,_true>
        ::operator[]((split_helper_index<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false,_true>
                      *)local_238,
                     (split_helper<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false,_true>
                      *)&local_3d8,0xcb2);
        detail::
        operator|<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_true,_nullptr>
                  (&local_90,&local_338,
                   (split_helper_index<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false,_true>
                    *)local_238);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_90._M_dataplus._M_p != &local_90.field_2) {
          operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
        }
        if ((pointer)local_238._0_8_ != pcVar3) {
          operator_delete((void *)local_238._0_8_,local_238._16_8_ + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3d8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p != paVar2) {
          operator_delete(local_3d8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                          local_3d8.m_part_result.super_iuCodeMessage.m_message.field_2.
                          _M_allocated_capacity + 1);
        }
        if (local_2f8 != &local_2e8) {
          operator_delete(local_2f8,
                          CONCAT71(local_2e8._M_allocated_capacity._1_7_,local_2e8._M_local_buf[0])
                          + 1);
        }
        memset((iu_global_format_stringstream *)local_238,0,0x188);
        iutest::iu_global_format_stringstream::iu_global_format_stringstream
                  ((iu_global_format_stringstream *)local_238);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_3d8,
                   "\nExpected: s | split(delim)[3250] throws an exception of type std::out_of_range.\n  Actual: it throws nothing."
                   ,(allocator<char> *)&local_368);
        local_3d8.m_part_result.super_iuCodeMessage.m_file =
             "/workspace/llm4binary/github/license_all_cmakelists_1510/yumetodo[P]string_split/test/test_lvalue.cpp"
        ;
        local_3d8.m_part_result.super_iuCodeMessage.m_line = 0x106;
        local_3d8.m_part_result.super_iuCodeMessage._44_4_ = 1;
        iutest::AssertionHelper::OnFixed(&local_3d8,(Fixed *)local_238);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3d8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p != paVar2) {
          operator_delete(local_3d8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                          local_3d8.m_part_result.super_iuCodeMessage.m_message.field_2.
                          _M_allocated_capacity + 1);
        }
        std::__cxx11::stringstream::~stringstream((stringstream *)local_238);
        std::ios_base::~ios_base(local_1b8);
        local_318 = &local_308;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_318,local_388,local_380 + (long)local_388);
        if (local_318 == &local_308) {
          local_3d8.m_part_result.super_iuCodeMessage.m_message.field_2._8_8_ = local_308._8_8_;
          local_3d8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p = (pointer)paVar2;
        }
        else {
          local_3d8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p =
               (pointer)local_318;
        }
        local_3d8.m_part_result.super_iuCodeMessage.m_message.field_2._M_allocated_capacity._1_7_ =
             local_308._M_allocated_capacity._1_7_;
        local_3d8.m_part_result.super_iuCodeMessage.m_message.field_2._M_local_buf[0] =
             local_308._M_local_buf[0];
        local_3d8.m_part_result.super_iuCodeMessage.m_message._M_string_length = local_310;
        local_310 = 0;
        local_308._M_local_buf[0] = '\0';
        local_318 = &local_308;
        detail::
        split_helper<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false,_true>
        ::operator[]((split_helper_index<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false,_true>
                      *)local_238,
                     (split_helper<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false,_true>
                      *)&local_3d8,0xffffffffffffffff);
        detail::
        operator|<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_true,_nullptr>
                  (&local_b0,&local_338,
                   (split_helper_index<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false,_true>
                    *)local_238);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
          operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
        }
        if ((pointer)local_238._0_8_ != pcVar3) {
          operator_delete((void *)local_238._0_8_,local_238._16_8_ + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3d8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p != paVar2) {
          operator_delete(local_3d8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                          local_3d8.m_part_result.super_iuCodeMessage.m_message.field_2.
                          _M_allocated_capacity + 1);
        }
        if (local_318 != &local_308) {
          operator_delete(local_318,
                          CONCAT71(local_308._M_allocated_capacity._1_7_,local_308._M_local_buf[0])
                          + 1);
        }
        memset((iu_global_format_stringstream *)local_238,0,0x188);
        iutest::iu_global_format_stringstream::iu_global_format_stringstream
                  ((iu_global_format_stringstream *)local_238);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_3d8,
                   "\nExpected: s | split(delim)[std::numeric_limits<std::size_t>::max()] throws an exception of type std::out_of_range.\n  Actual: it throws nothing."
                   ,(allocator<char> *)&local_368);
        local_3d8.m_part_result.super_iuCodeMessage.m_file =
             "/workspace/llm4binary/github/license_all_cmakelists_1510/yumetodo[P]string_split/test/test_lvalue.cpp"
        ;
        local_3d8.m_part_result.super_iuCodeMessage.m_line = 0x107;
        local_3d8.m_part_result.super_iuCodeMessage._44_4_ = 1;
        iutest::AssertionHelper::OnFixed(&local_3d8,(Fixed *)local_238);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3d8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p != paVar2) {
          operator_delete(local_3d8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                          local_3d8.m_part_result.super_iuCodeMessage.m_message.field_2.
                          _M_allocated_capacity + 1);
        }
        std::__cxx11::stringstream::~stringstream((stringstream *)local_238);
        std::ios_base::~ios_base(local_1b8);
        goto LAB_0018206b;
      }
      memset((iu_global_format_stringstream *)local_238,0,0x188);
      iutest::iu_global_format_stringstream::iu_global_format_stringstream
                ((iu_global_format_stringstream *)local_238);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_3d8,local_368.m_message._M_dataplus._M_p,
                 (allocator<char> *)&local_3a8);
      local_3d8.m_part_result.super_iuCodeMessage.m_file =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/yumetodo[P]string_split/test/test_lvalue.cpp"
      ;
      local_3d8.m_part_result.super_iuCodeMessage.m_line = 0x103;
      local_3d8.m_part_result.super_iuCodeMessage._44_4_ = 2;
      iutest::AssertionHelper::OnFixed(&local_3d8,(Fixed *)local_238);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3d8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p != paVar2) {
      operator_delete(local_3d8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                      local_3d8.m_part_result.super_iuCodeMessage.m_message.field_2.
                      _M_allocated_capacity + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_238);
    std::ios_base::~ios_base(local_1b8);
    bVar5 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_368.m_message._M_dataplus._M_p == paVar4;
  }
  if (!bVar5) {
    operator_delete(local_368.m_message._M_dataplus._M_p,
                    local_368.m_message.field_2._M_allocated_capacity + 1);
  }
LAB_0018206b:
  if (local_388 != local_378) {
    operator_delete(local_388,local_378[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_338._M_dataplus._M_p != &local_338.field_2) {
    operator_delete(local_338._M_dataplus._M_p,local_338.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

IUTEST_TYPED_TEST(StringSplitLvalue, chain_at_last_by_c_str)
{
	using char_type = TypeParam;
	const std::basic_string<char_type> s = constant::arikitari_na_world_underscore<char_type>();
	const auto re = s | split(constant::space_underscore<char_type>()) >> at_last();
	IUTEST_ASSERT(2u == re.size());
	IUTEST_ASSERT_EQ(constant::arikitari_na<char_type>(), re[0]);
	IUTEST_ASSERT_EQ(constant::world<char_type>(), re[1]);
}